

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O1

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::extract_solution
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,vector<int,_std::allocator<int>_> *_dem,int T)

{
  _Rb_tree_node_base *__args;
  _Rb_tree_header *p_Var1;
  iterator __position;
  key_type *pkVar2;
  ulong uVar3;
  iterator __position_00;
  pointer ppVar4;
  undefined4 uVar5;
  int iVar6;
  pointer ppVar7;
  int iVar8;
  vector<Arc,std::allocator<Arc>> *this_00;
  _Base_ptr p_Var9;
  mapped_type *pmVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  size_type sVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  runtime_error *this_01;
  key_type *__k;
  key_type *__k_00;
  int v_1;
  int lbl;
  int v;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  sol;
  vector<int,_std::allocator<int>_> lst;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> dp;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  adj;
  int u;
  int local_280;
  int local_27c;
  ArcflowSol *local_278;
  int *local_270;
  int local_264;
  vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *local_260;
  int *local_258;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *local_250;
  _Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
  local_248;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_218;
  vector<int,_std::allocator<int>_> *local_1f8;
  key_type *local_1f0;
  key_type *local_1e8;
  key_type *local_1e0;
  key_type *local_1d8;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_1c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_198;
  _Rb_tree<int,_std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  local_168;
  pair<int,_std::vector<int,_std::allocator<int>_>_> local_138 [8];
  
  local_198._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198._M_impl.super__Rb_tree_header._M_header;
  local_198._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_168._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_168._M_impl.super__Rb_tree_header._M_header;
  local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = (this->flow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->flow)._M_t._M_impl.super__Rb_tree_header;
  local_27c = T;
  local_278 = this;
  local_260 = __return_storage_ptr__;
  local_1f8 = _dem;
  local_198._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198._M_impl.super__Rb_tree_header._M_header._M_left;
  local_168._M_impl.super__Rb_tree_header._M_header._M_right =
       local_168._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    do {
      local_138[0].first = p_Var9[1]._M_color;
      local_248._M_impl._0_4_ = *(undefined4 *)&p_Var9[1].field_0x4;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_198,&local_138[0].first);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_198,(int *)&local_248);
      if (local_248._M_impl._0_4_ != local_278->S) {
        this_00 = (vector<Arc,std::allocator<Arc>> *)
                  std::
                  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                  ::operator[]((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                                *)&local_168,(key_type *)&local_248);
        __args = p_Var9 + 1;
        __position._M_current = *(Arc **)(this_00 + 8);
        if (__position._M_current == *(Arc **)(this_00 + 0x10)) {
          std::vector<Arc,std::allocator<Arc>>::_M_realloc_insert<Arc_const&>
                    (this_00,__position,(Arc *)__args);
        }
        else {
          (__position._M_current)->label = *(int *)&p_Var9[1]._M_parent;
          uVar5 = *(undefined4 *)&__args->field_0x4;
          (__position._M_current)->u = __args->_M_color;
          (__position._M_current)->v = uVar5;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0xc;
        }
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  local_250 = &local_278->flow;
  local_138[0]._4_4_ = local_278->S;
  local_138[0].first = local_27c;
  local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(local_138[0].second.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,local_278->LOSS);
  local_258 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
              operator[](local_250,(key_type *)local_138);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)&local_1e0,
             (_Rb_tree_const_iterator<int>)local_198._M_impl.super__Rb_tree_header._M_header._M_left
             ,(_Rb_tree_const_iterator<int>)&local_198._M_impl.super__Rb_tree_header,
             (allocator_type *)local_138);
  local_270 = &local_278->S;
  local_218.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    local_248._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_248._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_248._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_248._M_impl.super__Rb_tree_header._M_header;
    local_248._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1c8._M_impl.super__Rb_tree_header._M_header;
    local_1c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar8 = *local_258;
    local_248._M_impl.super__Rb_tree_header._M_header._M_right =
         local_248._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1c8._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_1c8,local_270);
    *pmVar10 = iVar8;
    local_1f0 = local_1d8;
    __k = local_1e0;
    if (local_1e0 != local_1d8) {
      do {
        pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_1c8,__k);
        pmVar11 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
                  operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                              *)&local_248,__k);
        local_1e8 = __k;
        pmVar12 = std::
                  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                  ::operator[]((map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
                                *)&local_168,__k);
        pkVar2 = (pmVar12->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__k_00 = (pmVar12->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.
                      super__Vector_impl_data._M_start; __k_00 != pkVar2; __k_00 = __k_00 + 1) {
          sVar13 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   count((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_1c8,&__k_00->u);
          if (sVar13 == 0) {
            snprintf((char *)local_138,0x100,
                     "AssertionError: assertion `%s` failed in \"%s\" line %d","dp.count(a.u) != 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                     ,0x84);
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,(char *)local_138);
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          pmVar14 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                  *)&local_1c8,&__k_00->u);
          pmVar15 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>
                    ::operator[](local_250,__k_00);
          iVar8 = *pmVar14;
          if (*pmVar15 < *pmVar14) {
            iVar8 = *pmVar15;
          }
          if (*pmVar10 < iVar8) {
            pmVar11->label = __k_00->label;
            iVar6 = __k_00->v;
            pmVar11->u = __k_00->u;
            pmVar11->v = iVar6;
            *pmVar10 = iVar8;
          }
        }
        __k = local_1e8 + 1;
      } while (__k != local_1f0);
    }
    pmVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
              operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          *)&local_1c8,&local_27c);
    iVar8 = *pmVar10;
    *local_258 = *local_258 - iVar8;
    if (iVar8 == 0) break;
    local_280 = local_27c;
    local_138[0]._0_8_ = local_138[0]._0_8_ & 0xffffffff00000000;
    local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::pair<int,std::vector<int,std::allocator<int>>>>
              ((vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
                *)&local_218,local_138);
    if (local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ppVar7 = local_218.
             super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_218.
    super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].first = iVar8;
    if (local_280 != *local_270) {
      ppVar4 = local_218.
               super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      do {
        pmVar11 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
                  operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                              *)&local_248,&local_280);
        local_264 = pmVar11->label;
        local_138[0].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_138[0].second.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,local_264);
        uVar3._0_4_ = pmVar11->u;
        uVar3._4_4_ = pmVar11->v;
        local_138[0]._0_8_ = uVar3;
        if (local_264 != local_278->LOSS) {
          __position_00._M_current =
               ppVar7[-1].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              ppVar7[-1].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&ppVar4->second,__position_00,&local_264);
          }
          else {
            *__position_00._M_current = local_264;
            ppVar7[-1].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
        pmVar10 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
                  operator[](local_250,(key_type *)local_138);
        *pmVar10 = *pmVar10 - iVar8;
        local_280 = (undefined4)uVar3;
      } while ((undefined4)uVar3 != *local_270);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_1c8);
    std::
    _Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
    ::~_Rb_tree(&local_248);
    if (iVar8 == 0) {
LAB_00110c29:
      remove_excess(local_260,local_278,&local_218,local_1f8);
      std::
      vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector(&local_218);
      if (local_1e0 != (key_type *)0x0) {
        operator_delete(local_1e0);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
      ::~_Rb_tree(&local_168);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_198);
      return local_260;
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_1c8);
  std::
  _Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
  ::~_Rb_tree(&local_248);
  goto LAB_00110c29;
}

Assistant:

std::vector<pattern_pair> ArcflowSol::extract_solution(std::vector<int> *_dem, int T) {
	std::vector<int> &dem = *_dem;
	std::set<int> nodes;
	std::map<int, std::vector<Arc>> adj;
	for (const auto &kvpair : flow) {
		int u = kvpair.first.u;
		int v = kvpair.first.v;
		nodes.insert(u);
		nodes.insert(v);
		if (v != S) {
			adj[v].push_back(kvpair.first);
		}
	}

	int &zflow = flow[Arc(T, S, LOSS)];

	std::vector<int> lst(all(nodes));

	std::vector<pattern_int> sol;
	while (true) {
		std::map<int, Arc> pred;
		std::map<int, int> dp;
		dp[S] = zflow;
		for (const int &v : lst) {
			int &val = dp[v];
			Arc &p = pred[v];
			for (const Arc &a : adj[v]) {
				throw_assert(dp.count(a.u) != 0);
				int mf = std::min(dp[a.u], flow[a]);
				if (mf > val) {
					p = a;
					val = mf;
				}
			}
		}
		int f = dp[T];
		zflow -= f;
		if (f == 0) {
			break;
		}
		int v = T;
		sol.push_back(pattern_int());
		pattern_int &patt = sol.back();
		patt.first = f;
		while (v != S) {
			Arc a = pred[v];
			int u = a.u;
			int lbl = a.label;
			if (lbl != LOSS) {
				patt.second.push_back(lbl);
			}
			flow[a] -= f;
			v = u;
		}
	}
	return remove_excess(sol, &dem);
}